

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall
OpenMD::PotVecAccumulator::get95percentConfidenceInterval(PotVecAccumulator *this,ResultType *ret)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  PotVecAccumulator *in_RSI;
  long in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  uint i;
  ResultType sd;
  uint local_4c;
  ResultType *in_stack_ffffffffffffffe8;
  
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&stack0xffffffffffffffb8);
  getStdDev(in_RSI,in_stack_ffffffffffffffe8);
  for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
    pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)&stack0xffffffffffffffb8,local_4c)
    ;
    dVar1 = *pdVar3;
    uVar2 = *(undefined8 *)(in_RDI + 8);
    auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = sqrt((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)in_RSI,local_4c);
    *pdVar3 = (dVar1 * 1.96) / dVar4;
  }
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = 1.960 * sd[i] / sqrt(RealType(Count_));
      }
      return;
    }